

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_scatter2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  Integer IVar5;
  C_Integer *pCVar6;
  long lVar7;
  Integer IVar8;
  int iVar9;
  void *__ptr;
  logical lVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  void **ppvVar21;
  long *plVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  armci_giov_t desc;
  Integer hi [2];
  Integer lo [2];
  Integer subscrpt [2];
  Integer _lo [2];
  char err_string [256];
  
  if (nv < 1) {
    return;
  }
  lVar34 = g_a + 1000;
  iVar9 = GA[g_a + 1000].type;
  if ((g_a < -1000) || (_max_global_array <= lVar34)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_scatter");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar34].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_scatter");
    pnga_error(err_string,g_a);
  }
  GAstat.numsca = GAstat.numsca + 1;
  iVar3 = GA[lVar34].p_handle;
  lVar17 = (long)iVar3;
  if (lVar17 < 0) {
    lVar33 = GA[lVar34].num_rstrctd;
    if (GA[lVar34].num_rstrctd < 1) {
      lVar33 = GAnproc;
    }
  }
  else {
    lVar33 = (long)PGRP_LIST[lVar17].map_nproc;
  }
  if (GA[lVar34].distr_type == 0) {
    __ptr = malloc((nv << 0x20) + (lVar33 << 0x22) >> 0x1d);
    if (__ptr == (void *)0x0) {
      lVar14 = lVar33;
      lVar30 = 0;
      goto LAB_00170649;
    }
    lVar30 = 0;
  }
  else {
    lVar14 = GA[lVar34].block_total;
    __ptr = malloc((nv << 0x20) + (lVar14 << 0x22) >> 0x1d);
    lVar30 = lVar14;
    if (__ptr == (void *)0x0) {
LAB_00170649:
      pnga_error("malloc failed",lVar14 * 3);
      __ptr = (void *)0x0;
    }
  }
  pgVar1 = GA;
  bVar35 = GA[lVar34].distr_type == 0;
  lVar14 = lVar30;
  if (bVar35) {
    lVar14 = lVar33;
  }
  lVar7 = lVar14 * 8 + nv * 8;
  if (bVar35) {
    if (0 < lVar33) {
      lVar18 = 0;
      do {
        *(undefined8 *)((long)__ptr + lVar18 * 8 + nv * 8) = 0;
        *(undefined8 *)((long)__ptr + lVar18 * 8 + lVar7) = 0;
        lVar18 = lVar18 + 1;
      } while (lVar33 != lVar18);
    }
  }
  else if (0 < lVar30) {
    lVar18 = 0;
    do {
      *(undefined8 *)((long)__ptr + lVar18 * 8 + nv * 8) = 0;
      *(undefined8 *)((long)__ptr + lVar18 * 8 + lVar7) = 0;
      lVar18 = lVar18 + 1;
    } while (lVar30 != lVar18);
  }
  lVar18 = 1;
  if (1 < nv) {
    lVar18 = nv;
  }
  if (pgVar1[lVar34].num_rstrctd == 0) {
    lVar29 = 0;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar29);
      subscrpt[1] = *(Integer *)((long)j + lVar29);
      lVar10 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar29));
      if (lVar10 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar29),
                *(undefined8 *)((long)j + lVar29));
        pnga_error(err_string,g_a);
      }
      plVar12 = (long *)((long)__ptr + *(Integer *)((long)__ptr + lVar29) * 8 + lVar7);
      *plVar12 = *plVar12 + 1;
      lVar29 = lVar29 + 8;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  else {
    lVar29 = 0;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar29);
      subscrpt[1] = *(Integer *)((long)j + lVar29);
      lVar10 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar29));
      if (lVar10 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar29),
                *(undefined8 *)((long)j + lVar29));
        pnga_error(err_string,g_a);
      }
      plVar12 = (long *)((long)__ptr +
                        GA[lVar34].rank_rstrctd[*(Integer *)((long)__ptr + lVar29)] * 8 + lVar7);
      *plVar12 = *plVar12 + 1;
      lVar29 = lVar29 + 8;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  lVar18 = lVar14 * 0x10 + nv * 8;
  lVar14 = lVar14 * 0x18 + nv * 8;
  if (GA[lVar34].distr_type == 0) {
    if (0 < lVar33) {
      lVar30 = 0;
      lVar29 = 0;
      do {
        if (0 < *(long *)((long)__ptr + lVar30 * 8 + lVar7)) {
          *(long *)((long)__ptr + lVar29 * 8 + lVar18) = lVar30;
          *(long *)((long)__ptr + lVar30 * 8 + lVar14) = lVar29;
          lVar29 = lVar29 + 1;
        }
        lVar30 = lVar30 + 1;
      } while (lVar33 != lVar30);
      goto LAB_0017090a;
    }
  }
  else if (0 < lVar30) {
    lVar11 = 0;
    lVar29 = 0;
    do {
      if (0 < *(long *)((long)__ptr + lVar11 * 8 + lVar7)) {
        *(long *)((long)__ptr + lVar29 * 8 + lVar18) = lVar11;
        *(long *)((long)__ptr + lVar11 * 8 + lVar14) = lVar29;
        lVar29 = lVar29 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar30 != lVar11);
    goto LAB_0017090a;
  }
  lVar29 = 0;
LAB_0017090a:
  GAstat.numsca_procs = GAstat.numsca_procs + lVar29;
  lVar30 = nv * 0x10;
  plVar12 = (long *)malloc((long)((int)lVar29 * 0x38 + (int)lVar30 + (int)(lVar29 * 8)));
  if (plVar12 == (long *)0x0) {
    pnga_error("malloc failed",lVar29);
  }
  plVar22 = plVar12 + lVar29 * 2;
  lVar11 = lVar29 * 8 + lVar30;
  lVar32 = lVar29 * 8 + lVar11;
  lVar28 = lVar29 * 8 + lVar32;
  lVar13 = lVar29 * 8 + lVar28;
  if (GA[lVar34].distr_type == 0) {
    if (0 < lVar29) {
      lVar30 = 0;
      do {
        lVar11 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
        if (0 < GA[lVar34].num_rstrctd) {
          lVar11 = GA[lVar34].rstrctd_list[lVar11];
        }
        pnga_distribution(g_a,lVar11,lo,hi);
        plVar22[nv * 2 + lVar29 + lVar30] = lo[0];
        plVar22[nv * 2 + lVar29 * 3 + lVar30] = lo[1];
        plVar22[nv * 2 + lVar29 * 2 + lVar30] = hi[0];
        plVar22[nv * 2 + lVar29 * 4 + lVar30] = hi[1];
        pgVar1 = GA + lVar34;
        lVar11 = GA[lVar34].width[0];
        lVar32 = GA[lVar34].width[1];
        lVar28 = GA[lVar34].num_rstrctd;
        iVar16 = GA[lVar34].distr_type;
        if (iVar16 - 1U < 3) {
          sVar2 = pgVar1->ndim;
          uVar25 = (uint)sVar2;
          lVar13 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
          uVar19 = (long)(int)lVar13 % pgVar1->num_blocks[0];
          uVar15 = (undefined4)uVar19;
          err_string[0] = (char)uVar15;
          err_string[1] = (char)((uint)uVar15 >> 8);
          err_string[2] = (char)((uint)uVar15 >> 0x10);
          err_string[3] = (char)((uint)uVar15 >> 0x18);
          if (1 < (int)uVar25) {
            uVar19 = uVar19 & 0xffffffff;
            lVar31 = 0;
            do {
              lVar13 = (long)((int)lVar13 - (int)uVar19) / GA[g_a + 1000].num_blocks[lVar31];
              uVar19 = (long)(int)lVar13 % GA[g_a + 1000].num_blocks[lVar31 + 1];
              *(int *)(err_string + lVar31 * 4 + 4) = (int)uVar19;
              lVar31 = lVar31 + 1;
            } while ((ulong)uVar25 - 1 != lVar31);
          }
          if (0 < sVar2) {
            lVar13 = 0;
            do {
              iVar16 = *(int *)(err_string + lVar13);
              lVar31 = *(long *)((long)GA[g_a + 1000].block_dims + lVar13 * 2);
              *(long *)((long)_lo + lVar13 * 2) = lVar31 * iVar16 + 1;
              lVar31 = ((long)iVar16 + 1) * lVar31;
              *(long *)((long)&desc.src_ptr_array + lVar13 * 2) = lVar31;
              lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar13 * 2);
              if (lVar23 <= lVar31) {
                lVar31 = lVar23;
              }
              *(long *)((long)&desc.src_ptr_array + lVar13 * 2) = lVar31;
              lVar13 = lVar13 + 4;
            } while ((ulong)uVar25 << 2 != lVar13);
          }
        }
        else if (iVar16 == 4) {
          sVar2 = pgVar1->ndim;
          uVar25 = (uint)sVar2;
          lVar13 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
          uVar19 = (long)(int)lVar13 % pgVar1->num_blocks[0];
          uVar15 = (undefined4)uVar19;
          err_string[0] = (char)uVar15;
          err_string[1] = (char)((uint)uVar15 >> 8);
          err_string[2] = (char)((uint)uVar15 >> 0x10);
          err_string[3] = (char)((uint)uVar15 >> 0x18);
          if (1 < (int)uVar25) {
            uVar19 = uVar19 & 0xffffffff;
            lVar31 = 0;
            do {
              lVar13 = (long)((int)lVar13 - (int)uVar19) / GA[g_a + 1000].num_blocks[lVar31];
              uVar19 = (long)(int)lVar13 % GA[g_a + 1000].num_blocks[lVar31 + 1];
              *(int *)(err_string + lVar31 * 4 + 4) = (int)uVar19;
              lVar31 = lVar31 + 1;
            } while ((ulong)uVar25 - 1 != lVar31);
          }
          if (0 < sVar2) {
            pCVar6 = GA[lVar34].mapc;
            lVar13 = 0;
            iVar16 = 0;
            do {
              iVar4 = *(int *)(err_string + lVar13);
              lVar31 = (long)iVar16 + (long)iVar4;
              *(C_Integer *)((long)_lo + lVar13 * 2) = pCVar6[lVar31];
              if ((long)iVar4 < *(long *)((long)pgVar1->num_blocks + lVar13 * 2) + -1) {
                lVar31 = pgVar1->mapc[lVar31 + 1] + -1;
              }
              else {
                lVar31 = *(long *)((long)pgVar1->dims + lVar13 * 2);
              }
              *(long *)((long)&desc.src_ptr_array + lVar13 * 2) = lVar31;
              iVar16 = iVar16 + *(int *)((long)pgVar1->num_blocks + lVar13 * 2);
              lVar13 = lVar13 + 4;
            } while ((ulong)uVar25 << 2 != lVar13);
          }
        }
        else if (iVar16 == 0) {
          if (lVar28 == 0) {
            lVar13 = (long)pgVar1->ndim;
            if (lVar13 < 1) {
              lVar31 = 1;
            }
            else {
              lVar31 = 1;
              lVar23 = 0;
              do {
                lVar31 = lVar31 * GA[g_a + 1000].nblock[lVar23];
                lVar23 = lVar23 + 1;
              } while (lVar13 != lVar23);
            }
            lVar23 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
            if (-1 < lVar23 && lVar23 < lVar31) {
              if (0 < pgVar1->ndim) {
                pCVar6 = pgVar1->mapc;
                lVar31 = 0;
                lVar24 = 0;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[lVar31];
                  lVar20 = lVar23 % lVar27;
                  _lo[lVar31] = pCVar6[lVar20 + lVar24];
                  if (lVar20 == lVar27 + -1) {
                    ppvVar21 = (void **)GA[g_a + 1000].dims[lVar31];
                  }
                  else {
                    ppvVar21 = (void **)(pCVar6[lVar20 + lVar24 + 1] + -1);
                  }
                  lVar24 = lVar24 + lVar27;
                  (&desc.src_ptr_array)[lVar31] = ppvVar21;
                  lVar31 = lVar31 + 1;
                  lVar23 = lVar23 / lVar27;
                } while (lVar13 != lVar31);
              }
              goto LAB_00170f03;
            }
          }
          else {
            lVar31 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
            sVar2 = pgVar1->ndim;
            lVar13 = (long)sVar2;
            if (lVar31 < lVar28) {
              if (sVar2 < 1) {
                lVar23 = 1;
              }
              else {
                lVar23 = 1;
                lVar24 = 0;
                do {
                  lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar24];
                  lVar24 = lVar24 + 1;
                } while (lVar13 != lVar24);
              }
              if ((-1 < lVar31) && (lVar31 < lVar23)) {
                if (0 < sVar2) {
                  pCVar6 = pgVar1->mapc;
                  lVar23 = 0;
                  lVar24 = 0;
                  do {
                    lVar27 = (long)GA[g_a + 1000].nblock[lVar24];
                    lVar20 = lVar31 % lVar27;
                    _lo[lVar24] = pCVar6[lVar20 + lVar23];
                    if (lVar20 == lVar27 + -1) {
                      ppvVar21 = (void **)GA[g_a + 1000].dims[lVar24];
                    }
                    else {
                      ppvVar21 = (void **)(pCVar6[lVar20 + lVar23 + 1] + -1);
                    }
                    lVar23 = lVar23 + lVar27;
                    (&desc.src_ptr_array)[lVar24] = ppvVar21;
                    lVar24 = lVar24 + 1;
                    lVar31 = lVar31 / lVar27;
                  } while (lVar13 != lVar24);
                }
                goto LAB_00170f03;
              }
            }
          }
          if (0 < (short)lVar13) {
            memset(_lo,0,lVar13 << 3);
            memset(&desc,0xff,lVar13 << 3);
          }
        }
LAB_00170f03:
        IVar8 = _lo[1];
        IVar5 = _lo[0];
        ppvVar21 = desc.src_ptr_array;
        if (pgVar1->p_handle == 0) {
          lVar13 = (long)PGRP_LIST->inv_map_proc_list[*(long *)((long)__ptr + lVar30 * 8 + lVar18)];
        }
        else {
          lVar13 = *(long *)((long)__ptr + lVar30 * 8 + lVar18);
          if (lVar28 != 0) {
            lVar13 = pgVar1->rstrctd_list[lVar13];
          }
        }
        lVar28 = plVar22[nv * 2 + lVar29 + lVar30];
        if (((long)desc.src_ptr_array < lVar28 || lVar28 < _lo[0]) ||
           ((long)desc.dst_ptr_array < plVar22[nv * 2 + lVar29 * 3 + lVar30] ||
            plVar22[nv * 2 + lVar29 * 3 + lVar30] < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
                  *(undefined8 *)((long)__ptr + lVar30 * 8 + lVar18),lVar28,
                  plVar22[nv * 2 + lVar29 * 3 + lVar30],_lo[0],desc.src_ptr_array,_lo[1],
                  desc.dst_ptr_array);
          pnga_error(err_string,g_a);
        }
        lVar28 = ((lVar11 * 2 + 1) - IVar5) + (long)ppvVar21;
        plVar22[nv * 2 + lVar30] =
             (long)(GA[lVar34].ptr[lVar13] +
                   ((lVar11 - IVar5) + plVar22[nv * 2 + lVar29 + lVar30] +
                   ((lVar32 - IVar8) + plVar22[nv * 2 + lVar29 * 3 + lVar30]) * lVar28) *
                   *(long *)(BYTE_ARRAY_001d52b9 + (long)GA[lVar34].type * 0x10 + 0x4f));
        plVar22[nv * 2 + lVar29 * 5 + lVar30] = lVar28;
        lVar30 = lVar30 + 1;
      } while (lVar30 != lVar29);
    }
  }
  else if (0 < lVar29) {
    lVar23 = 0;
    lVar31 = lVar29;
    do {
      IVar5 = *(Integer *)((long)__ptr + lVar23 + lVar18);
      pnga_distribution(g_a,IVar5,lo,hi);
      *(Integer *)((long)plVar22 + lVar23 + lVar11) = lo[0];
      *(Integer *)((long)plVar22 + lVar23 + lVar28) = lo[1];
      *(Integer *)((long)plVar22 + lVar23 + lVar32) = hi[0];
      *(Integer *)((long)plVar22 + lVar23 + lVar13) = hi[1];
      pnga_access_block_ptr
                (g_a,IVar5,(void *)((long)plVar22 + lVar23 + lVar30),
                 (Integer *)((long)plVar22 + lVar23 + lVar29 * 8 + lVar13));
      lVar23 = lVar23 + 8;
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
  }
  lVar30 = *(long *)(BYTE_ARRAY_001d52b9 + (long)iVar9 * 0x10 + 0x4f);
  GAbytes.scatot = (double)lVar30 * (double)nv + GAbytes.scatot;
  GAbytes.scaloc =
       (double)lVar30 *
       (double)*(long *)((long)__ptr + *(long *)((long)__ptr + GAme * 8) * 8 + lVar7) +
       GAbytes.scaloc;
  *plVar12 = (long)plVar22;
  plVar12[lVar29] = (long)(plVar22 + nv);
  if (1 < lVar29) {
    lVar11 = *plVar12;
    lVar32 = plVar12[lVar29];
    lVar28 = 0;
    do {
      lVar13 = *(long *)((long)__ptr + *(long *)((long)__ptr + lVar28 * 8 + lVar18) * 8 + lVar7);
      lVar11 = lVar11 + lVar13 * 8;
      plVar12[lVar28 + 1] = lVar11;
      lVar32 = lVar32 + lVar13 * 8;
      plVar12[lVar29 + lVar28 + 1] = lVar32;
      lVar28 = lVar28 + 1;
    } while (lVar29 + -1 != lVar28);
  }
  lVar11 = 1;
  if (1 < nv) {
    lVar11 = nv;
  }
  lVar32 = 0;
  do {
    lVar28 = *(long *)((long)__ptr + lVar32 * 8);
    if (0 < GA[lVar34].num_rstrctd) {
      lVar28 = GA[lVar34].rank_rstrctd[lVar28];
    }
    lVar13 = *(long *)((long)__ptr + lVar28 * 8 + nv * 8);
    *(long *)((long)__ptr + lVar28 * 8 + nv * 8) = lVar13 + 1;
    uVar19 = *(ulong *)((long)__ptr + lVar28 * 8 + lVar14);
    *(void **)(plVar12[uVar19] + lVar13 * 8) = v;
    lVar28 = i[lVar32];
    if ((((lVar28 < plVar22[nv * 2 + lVar29 + uVar19]) ||
         (plVar22[nv * 2 + lVar29 * 2 + uVar19] < lVar28)) ||
        (j[lVar32] < plVar22[nv * 2 + lVar29 * 3 + uVar19])) ||
       (plVar22[nv * 2 + lVar29 * 4 + uVar19] < j[lVar32])) {
      sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar19 & 0xffffffff,
              lVar28,j[lVar32],plVar22[nv * 2 + lVar29 + uVar19],
              plVar22[nv * 2 + lVar29 * 2 + uVar19],plVar22[nv * 2 + lVar29 * 3 + uVar19],
              plVar22[nv * 2 + lVar29 * 4 + uVar19]);
      pnga_error(err_string,g_a);
    }
    *(Integer *)(plVar12[lVar29 + uVar19] + lVar13 * 8) =
         (((j[lVar32] - plVar22[nv * 2 + lVar29 * 3 + uVar19]) *
           plVar22[nv * 2 + lVar29 * 5 + uVar19] + i[lVar32]) - plVar22[nv * 2 + lVar29 + uVar19]) *
         lVar30 + plVar22[nv * 2 + uVar19];
    lVar32 = lVar32 + 1;
    v = (void *)((long)v + lVar30);
  } while (lVar11 != lVar32);
  iVar9 = (int)lVar30;
  switch(GA[lVar34].distr_type) {
  case 0:
    if (0 < lVar29) {
      lVar33 = 0;
      do {
        desc.src_ptr_array = (void **)plVar12[lVar33];
        desc.dst_ptr_array = (void **)plVar12[lVar29 + lVar33];
        uVar19 = *(ulong *)((long)__ptr + lVar33 * 8 + lVar18);
        desc.ptr_array_len = *(int *)((long)__ptr + uVar19 * 8 + lVar7);
        if (iVar3 < 0) {
          if (0 < GA[lVar34].num_rstrctd) {
            uVar19 = GA[lVar34].rstrctd_list[uVar19];
          }
        }
        else {
          uVar19 = (ulong)(uint)PGRP_LIST[lVar17].inv_map_proc_list[uVar19];
        }
        desc.bytes = iVar9;
        iVar16 = ARMCI_PutV(&desc,1,(int)uVar19);
        if (iVar16 != 0) {
          pnga_error("scatter failed in armci",(long)iVar16);
        }
        lVar33 = lVar33 + 1;
      } while (lVar29 != lVar33);
    }
    break;
  case 1:
    if (0 < lVar29) {
      lVar34 = 0;
      do {
        desc.src_ptr_array = (void **)plVar12[lVar34];
        desc.dst_ptr_array = (void **)plVar12[lVar29 + lVar34];
        lVar14 = *(long *)((long)__ptr + lVar34 * 8 + lVar18);
        uVar19 = lVar14 % lVar33;
        desc.ptr_array_len = *(int *)((long)__ptr + lVar14 * 8 + lVar7);
        if (-1 < iVar3) {
          uVar19 = (ulong)(uint)PGRP_LIST[lVar17].inv_map_proc_list[uVar19];
        }
        desc.bytes = iVar9;
        iVar16 = ARMCI_PutV(&desc,1,(int)uVar19);
        if (iVar16 != 0) {
          pnga_error("scatter failed in armci",(long)iVar16);
        }
        lVar34 = lVar34 + 1;
      } while (lVar29 != lVar34);
    }
    break;
  case 2:
    if (0 < lVar29) {
      lVar33 = 0;
      do {
        desc.src_ptr_array = (void **)plVar12[lVar33];
        desc.dst_ptr_array = (void **)plVar12[lVar29 + lVar33];
        lVar14 = *(long *)((long)__ptr + lVar33 * 8 + lVar18);
        desc.ptr_array_len = *(int *)((long)__ptr + lVar14 * 8 + lVar7);
        sVar2 = GA[lVar34].ndim;
        uVar25 = (uint)sVar2;
        lVar30 = (long)(int)lVar14 % GA[lVar34].num_blocks[0];
        if (1 < (int)uVar25) {
          lVar32 = 0;
          lVar11 = lVar30;
          do {
            lVar14 = ((int)lVar14 - lVar11) / GA[g_a + 1000].num_blocks[lVar32];
            lVar11 = (long)(int)lVar14 % GA[g_a + 1000].num_blocks[lVar32 + 1];
            *(long *)(err_string + lVar32 * 8 + 8) = lVar11;
            lVar32 = lVar32 + 1;
          } while ((ulong)uVar25 - 1 != lVar32);
        }
        err_string._0_8_ = lVar30 % (long)GA[lVar34].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar34].nblock[1];
        if (0 < sVar2) {
          uVar19 = 0;
          do {
            _lo[uVar19] = *(long *)(err_string + uVar19 * 8) % (long)GA[g_a + 1000].nblock[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar25 != uVar19);
        }
        uVar19 = _lo[(long)(int)uVar25 + -1];
        if (1 < sVar2) {
          uVar26 = (ulong)(uVar25 - 2);
          do {
            uVar19 = (long)GA[g_a + 1000].nblock[uVar26] * uVar19 + _lo[uVar26];
            bVar35 = 0 < (long)uVar26;
            uVar26 = uVar26 - 1;
          } while (bVar35);
        }
        if (-1 < iVar3) {
          uVar19 = (ulong)(uint)PGRP_LIST[lVar17].inv_map_proc_list[uVar19];
        }
        desc.bytes = iVar9;
        iVar16 = ARMCI_PutV(&desc,1,(int)uVar19);
        if (iVar16 != 0) {
          pnga_error("scatter failed in armci",(long)iVar16);
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 != lVar29);
    }
    break;
  case 3:
  case 4:
    if (0 < lVar29) {
      lVar33 = 0;
      do {
        desc.src_ptr_array = (void **)plVar12[lVar33];
        desc.dst_ptr_array = (void **)plVar12[lVar29 + lVar33];
        lVar14 = *(long *)((long)__ptr + lVar33 * 8 + lVar18);
        desc.ptr_array_len = *(int *)((long)__ptr + lVar14 * 8 + lVar7);
        sVar2 = GA[lVar34].ndim;
        uVar25 = (uint)sVar2;
        lVar30 = (long)(int)lVar14 % GA[lVar34].num_blocks[0];
        if (1 < (int)uVar25) {
          lVar32 = 0;
          lVar11 = lVar30;
          do {
            lVar14 = ((int)lVar14 - lVar11) / GA[g_a + 1000].num_blocks[lVar32];
            lVar11 = (long)(int)lVar14 % GA[g_a + 1000].num_blocks[lVar32 + 1];
            *(long *)(err_string + lVar32 * 8 + 8) = lVar11;
            lVar32 = lVar32 + 1;
          } while ((ulong)uVar25 - 1 != lVar32);
        }
        err_string._0_8_ = lVar30 % (long)GA[lVar34].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar34].nblock[1];
        if (0 < sVar2) {
          uVar19 = 0;
          do {
            _lo[uVar19] = *(long *)(err_string + uVar19 * 8) % (long)GA[g_a + 1000].nblock[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar25 != uVar19);
        }
        uVar19 = _lo[(long)(int)uVar25 + -1];
        if (1 < sVar2) {
          uVar26 = (ulong)(uVar25 - 2);
          do {
            uVar19 = (long)GA[g_a + 1000].nblock[uVar26] * uVar19 + _lo[uVar26];
            bVar35 = 0 < (long)uVar26;
            uVar26 = uVar26 - 1;
          } while (bVar35);
        }
        if (-1 < iVar3) {
          uVar19 = (ulong)(uint)PGRP_LIST[lVar17].inv_map_proc_list[uVar19];
        }
        desc.bytes = iVar9;
        iVar16 = ARMCI_PutV(&desc,1,(int)uVar19);
        if (iVar16 != 0) {
          pnga_error("scatter failed in armci",(long)iVar16);
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 != lVar29);
    }
  }
  free(plVar12);
  free(__ptr);
  return;
}

Assistant:

void pnga_scatter2d(Integer g_a, void *v, Integer *i, Integer *j, Integer nv)
{
    register Integer k;
    Integer kk;
    Integer item_size;
    Integer proc, type=GA[GA_OFFSET + g_a].type;
    Integer nproc, p_handle, iproc;
    Integer subscrpt[2];

    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    
    if (nv < 1) return;
    
    ga_check_handleM(g_a, "ga_scatter");
    
    GAstat.numsca++;
    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }
    
    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int) (nproc *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int) (num_blocks *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
   
    owner = (Integer *)buf1;  
    count = owner+ nv;  
    if (GA[handle].distr_type == REGULAR) {
      nelem =  count + nproc;  
      aproc = count + 2 * nproc;  
      map = count + 3 * nproc;  
    } else {
      nelem =  count + num_blocks;  
      aproc = count + 2 * num_blocks;  
      map = count + 3 * num_blocks;  
    }

    /* initialize the counters and nelem */
    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }
    
    /* find proc that owns the (i,j) element; store it in temp:  */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    
    GAstat.numsca_procs += naproc;

    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
                    iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    /* determine limit for message size --  v,i, & j will travel together */
    item_size = GAsizeofM(type);
    GAbytes.scatot += (double)item_size*nv ;
    iproc = owner[GAme];
    GAbytes.scaloc += (double)item_size* nelem[iproc];
    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
                    proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc];
        ptr_src[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
             (int)proc, (long)i[k], (long)j[k], (long)ilo[proc], 
             (long)ihi[proc], (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_dst[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);

}